

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Integrate.cpp
# Opt level: O1

double __thiscall chrono::ChFunction_Integrate::Get_y(ChFunction_Integrate *this,double x)

{
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int iVar4;
  double *pdVar5;
  uint uVar6;
  int iVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  dVar2 = this->x_start;
  dVar8 = 0.0;
  if ((dVar2 <= x) && (x <= this->x_end)) {
    iVar4 = this->num_samples;
    lVar1 = (long)iVar4 + -1;
    iVar7 = (int)lVar1;
    dVar2 = ((x - dVar2) / (this->x_end - dVar2)) * (double)iVar7;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar2;
    auVar9 = vroundsd_avx(auVar9,auVar9,9);
    uVar6 = (uint)auVar9._0_8_;
    if ((int)uVar6 < iVar7) {
      if ((int)uVar6 < 0) {
        if ((this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows < 1) goto LAB_008aeca2;
        dVar8 = *(this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
      }
      else {
        lVar1 = (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if ((lVar1 <= (long)(ulong)uVar6) || (lVar1 <= (long)(ulong)(uVar6 + 1))) {
LAB_008aeca2:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Array<double, -1, 1>, Level = 0]"
                       );
        }
        dVar2 = dVar2 - (double)(int)uVar6;
        pdVar5 = (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = pdVar5[uVar6];
        auVar10._8_8_ = 0;
        auVar10._0_8_ = dVar2 * pdVar5[uVar6 + 1];
        auVar11._8_8_ = 0;
        auVar11._0_8_ = 1.0 - dVar2;
        auVar9 = vfmadd231sd_fma(auVar10,auVar11,auVar3);
        dVar8 = auVar9._0_8_;
      }
    }
    else {
      if ((iVar4 < 1) ||
         ((this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar1)) goto LAB_008aeca2;
      dVar8 = (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data[(long)iVar4 + -1];
    }
  }
  return dVar8;
}

Assistant:

double ChFunction_Integrate::Get_y(double x) const {
    if ((x < x_start) || (x > x_end))
        return 0.0;
    int i_a, i_b;
    double position = (double)(num_samples - 1) * ((x - x_start) / (x_end - x_start));
    i_a = (int)(floor(position));
    i_b = i_a + 1;

    if (i_b > num_samples - 1)
        return array_x(num_samples - 1);

    if (i_a < 0)
        return array_x(0);

    double weightB = position - (double)i_a;
    double weightA = 1 - weightB;

    return (weightA * (array_x(i_a)) + weightB * (array_x(i_b)));
}